

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O0

int __thiscall
Signal<std::shared_ptr<Transcript>_>::Connect
          (Signal<std::shared_ptr<Transcript>_> *this,
          function<void_(std::shared_ptr<Transcript>)> *slot)

{
  pair<int,_std::function<void_(std::shared_ptr<Transcript>)>_> local_40;
  function<void_(std::shared_ptr<Transcript>)> *local_18;
  function<void_(std::shared_ptr<Transcript>)> *slot_local;
  Signal<std::shared_ptr<Transcript>_> *this_local;
  
  this->current_id_ = this->current_id_ + 1;
  local_18 = slot;
  slot_local = (function<void_(std::shared_ptr<Transcript>)> *)this;
  std::make_pair<int&,std::function<void(std::shared_ptr<Transcript>)>const&>
            (&local_40,&this->current_id_,slot);
  std::
  map<int,std::function<void(std::shared_ptr<Transcript>)>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>>
  ::insert<std::pair<int,std::function<void(std::shared_ptr<Transcript>)>>>
            ((map<int,std::function<void(std::shared_ptr<Transcript>)>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>>
              *)this,&local_40);
  std::pair<int,_std::function<void_(std::shared_ptr<Transcript>)>_>::~pair(&local_40);
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }